

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgGeneratorState.hpp
# Opt level: O1

float rsg::anon_unknown_0::getWeight<rsg::ConditionalStatement>(GeneratorState *state)

{
  float fVar1;
  
  fVar1 = 0.0;
  if ((state->m_programParams->useConditionals == true) &&
     (1 < state->m_shaderParams->maxStatementDepth -
          (int)((ulong)((long)(state->m_statementStack->
                              super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(state->m_statementStack->
                             super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3))) {
    fVar1 = 1.0;
  }
  return fVar1;
}

Assistant:

const ProgramParameters&	getProgramParameters		(void) const	{ return m_programParams;	}